

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  secp256k1_fe c;
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  uint16_t t16 [32];
  
  c.n[0] = a->n[0];
  c.n[1] = a->n[1];
  c.n[2] = a->n[2];
  c.n[3] = a->n[3];
  c.n[4] = a->n[4];
  c.magnitude = a->magnitude;
  c.normalized = a->normalized;
  if (use_sqr == 0) {
    secp256k1_fe_mul(&c,&c,b);
  }
  else {
    secp256k1_fe_sqr(&c,&c);
  }
  an.n[0] = a->n[0];
  an.n[1] = a->n[1];
  an.n[2] = a->n[2];
  an.n[3] = a->n[3];
  an.n[4] = a->n[4];
  an.magnitude = a->magnitude;
  an.normalized = a->normalized;
  bn.n[0] = b->n[0];
  bn.n[1] = b->n[1];
  bn.n[2] = b->n[2];
  bn.n[3] = b->n[3];
  bn.n[4] = b->n[4];
  bn.magnitude = b->magnitude;
  bn.normalized = b->normalized;
  secp256k1_fe_normalize_var(&c);
  secp256k1_fe_normalize_var(&an);
  secp256k1_fe_normalize_var(&bn);
  secp256k1_fe_get_b32(a32,&an);
  secp256k1_fe_get_b32(b32,&bn);
  secp256k1_fe_get_b32(c32,&c);
  lVar2 = 0x10;
  lVar3 = 0;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    *(ushort *)((long)a16 + lVar3) =
         *(ushort *)(a32 + lVar2 * 2) << 8 | *(ushort *)(a32 + lVar2 * 2) >> 8;
    *(ushort *)((long)b16 + lVar3) =
         *(ushort *)(b32 + lVar2 * 2) << 8 | *(ushort *)(b32 + lVar2 * 2) >> 8;
    *(ushort *)((long)c16 + lVar3) =
         *(ushort *)(c32 + lVar2 * 2) << 8 | *(ushort *)(c32 + lVar2 * 2) >> 8;
    lVar3 = lVar3 + 2;
  }
  mulmod256(t16,a16,b16,test_fe_mul::m16);
  iVar1 = secp256k1_memcmp_var(t16,c16,0x20);
  if (iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
          ,0xc4c,"test condition failed: secp256k1_memcmp_var(t16, c16, 32) == 0");
  abort();
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}